

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.cpp
# Opt level: O2

ContentSpecNode * __thiscall
xercesc_4_0::ComplexTypeInfo::expandContentModel
          (ComplexTypeInfo *this,ContentSpecNode *specNode,int minOccurs,int maxOccurs,
          bool bAllowCompactSyntax)

{
  MemoryManager *pMVar1;
  ContentSpecNode *pCVar2;
  ContentSpecNode *pCVar3;
  ContentSpecNode *pCVar4;
  NodeTypes NVar5;
  int iVar6;
  int j;
  bool bVar7;
  
  if (specNode == (ContentSpecNode *)0x0) {
    pCVar2 = (ContentSpecNode *)0x0;
  }
  else {
    pCVar2 = specNode;
    if ((minOccurs ^ 1U) != 0 || (maxOccurs ^ 1U) != 0) {
      if ((maxOccurs ^ 1U) == 0 && minOccurs == 0) {
        pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
        NVar5 = ZeroOrOne;
      }
      else if (minOccurs == 0 && maxOccurs == -1) {
        pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
        NVar5 = ZeroOrMore;
      }
      else if ((minOccurs ^ 1U) == 0 && maxOccurs == -1) {
        pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
        NVar5 = OneOrMore;
      }
      else {
        if ((!bAllowCompactSyntax) ||
           ((specNode->fType != Leaf &&
            (2 < (uint)((specNode->fType & (Any_NS|Any_Other)) + ~Sequence))))) {
          if (maxOccurs == -1) {
            pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
            pMVar1 = this->fMemoryManager;
            (pCVar2->super_XSerializable)._vptr_XSerializable =
                 (_func_int **)&PTR__ContentSpecNode_00404df0;
            pCVar2->fMemoryManager = pMVar1;
            pCVar2->fElement = (QName *)0x0;
            pCVar2->fElementDecl = (XMLElementDecl *)0x0;
            pCVar2->fFirst = specNode;
            pCVar2->fSecond = (ContentSpecNode *)0x0;
            pCVar2->fType = OneOrMore;
            pCVar2->fAdoptFirst = true;
            pCVar2->fAdoptSecond = true;
            pCVar2->fMinOccurs = 1;
            pCVar2->fMaxOccurs = 1;
            iVar6 = 1;
            if (1 < minOccurs) {
              iVar6 = minOccurs;
            }
            while (iVar6 + -1 != 0) {
              pCVar3 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
              pMVar1 = this->fMemoryManager;
              (pCVar3->super_XSerializable)._vptr_XSerializable =
                   (_func_int **)&PTR__ContentSpecNode_00404df0;
              pCVar3->fMemoryManager = pMVar1;
              pCVar3->fElement = (QName *)0x0;
              pCVar3->fElementDecl = (XMLElementDecl *)0x0;
              pCVar3->fFirst = specNode;
              pCVar3->fSecond = pCVar2;
              pCVar3->fType = Sequence;
              pCVar3->fAdoptFirst = false;
              pCVar3->fAdoptSecond = true;
              pCVar3->fMinOccurs = 1;
              pCVar3->fMaxOccurs = 1;
              pCVar2 = pCVar3;
              iVar6 = iVar6 + -1;
            }
            return pCVar2;
          }
          if (minOccurs != 0) {
            if (1 < minOccurs) {
              pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
              pMVar1 = this->fMemoryManager;
              (pCVar2->super_XSerializable)._vptr_XSerializable =
                   (_func_int **)&PTR__ContentSpecNode_00404df0;
              pCVar2->fMemoryManager = pMVar1;
              pCVar2->fElement = (QName *)0x0;
              pCVar2->fElementDecl = (XMLElementDecl *)0x0;
              pCVar2->fFirst = specNode;
              pCVar2->fSecond = specNode;
              pCVar2->fType = Sequence;
              pCVar2->fAdoptFirst = true;
              pCVar2->fAdoptSecond = false;
              pCVar2->fMinOccurs = 1;
              pCVar2->fMaxOccurs = 1;
              iVar6 = minOccurs + -2;
              while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
                pCVar3 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
                pMVar1 = this->fMemoryManager;
                (pCVar3->super_XSerializable)._vptr_XSerializable =
                     (_func_int **)&PTR__ContentSpecNode_00404df0;
                pCVar3->fMemoryManager = pMVar1;
                pCVar3->fElement = (QName *)0x0;
                pCVar3->fElementDecl = (XMLElementDecl *)0x0;
                pCVar3->fFirst = pCVar2;
                pCVar3->fSecond = specNode;
                pCVar3->fType = Sequence;
                pCVar3->fAdoptFirst = true;
                pCVar3->fAdoptSecond = false;
                pCVar3->fMinOccurs = 1;
                pCVar3->fMaxOccurs = 1;
                pCVar2 = pCVar3;
              }
            }
            if (maxOccurs <= minOccurs) {
              return pCVar2;
            }
            pCVar4 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
            pMVar1 = this->fMemoryManager;
            (pCVar4->super_XSerializable)._vptr_XSerializable =
                 (_func_int **)&PTR__ContentSpecNode_00404df0;
            pCVar4->fMemoryManager = pMVar1;
            pCVar4->fElement = (QName *)0x0;
            pCVar4->fElementDecl = (XMLElementDecl *)0x0;
            pCVar4->fFirst = specNode;
            pCVar4->fSecond = (ContentSpecNode *)0x0;
            pCVar4->fType = ZeroOrOne;
            pCVar4->fAdoptFirst = false;
            pCVar4->fAdoptSecond = true;
            pCVar4->fMinOccurs = 1;
            pCVar4->fMaxOccurs = 1;
            pCVar3 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
            pMVar1 = this->fMemoryManager;
            (pCVar3->super_XSerializable)._vptr_XSerializable =
                 (_func_int **)&PTR__ContentSpecNode_00404df0;
            pCVar3->fMemoryManager = pMVar1;
            pCVar3->fElement = (QName *)0x0;
            pCVar3->fElementDecl = (XMLElementDecl *)0x0;
            pCVar3->fFirst = pCVar2;
            pCVar3->fSecond = pCVar4;
            pCVar3->fType = Sequence;
            pCVar3->fAdoptFirst = true;
            pCVar3->fAdoptSecond = true;
            pCVar3->fMinOccurs = 1;
            pCVar3->fMaxOccurs = 1;
            for (iVar6 = 1; iVar6 < maxOccurs - minOccurs; iVar6 = iVar6 + 1) {
              pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
              pMVar1 = this->fMemoryManager;
              (pCVar2->super_XSerializable)._vptr_XSerializable =
                   (_func_int **)&PTR__ContentSpecNode_00404df0;
              pCVar2->fMemoryManager = pMVar1;
              pCVar2->fElement = (QName *)0x0;
              pCVar2->fElementDecl = (XMLElementDecl *)0x0;
              pCVar2->fFirst = pCVar3;
              pCVar2->fSecond = pCVar4;
              pCVar2->fType = Sequence;
              pCVar2->fAdoptFirst = true;
              pCVar2->fAdoptSecond = false;
              pCVar2->fMinOccurs = 1;
              pCVar2->fMaxOccurs = 1;
              pCVar3 = pCVar2;
            }
            return pCVar3;
          }
          pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
          pMVar1 = this->fMemoryManager;
          (pCVar2->super_XSerializable)._vptr_XSerializable =
               (_func_int **)&PTR__ContentSpecNode_00404df0;
          pCVar2->fMemoryManager = pMVar1;
          pCVar2->fElement = (QName *)0x0;
          pCVar2->fElementDecl = (XMLElementDecl *)0x0;
          pCVar2->fFirst = specNode;
          pCVar2->fSecond = (ContentSpecNode *)0x0;
          pCVar2->fType = ZeroOrOne;
          pCVar2->fAdoptFirst = true;
          pCVar2->fAdoptSecond = true;
          iVar6 = 1;
          if (1 < maxOccurs) {
            iVar6 = maxOccurs;
          }
          pCVar2->fMinOccurs = 1;
          pCVar2->fMaxOccurs = 1;
          pCVar3 = pCVar2;
          while (iVar6 = iVar6 + -1, iVar6 != 0) {
            pCVar4 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
            pMVar1 = this->fMemoryManager;
            (pCVar4->super_XSerializable)._vptr_XSerializable =
                 (_func_int **)&PTR__ContentSpecNode_00404df0;
            pCVar4->fMemoryManager = pMVar1;
            pCVar4->fElement = (QName *)0x0;
            pCVar4->fElementDecl = (XMLElementDecl *)0x0;
            pCVar4->fFirst = pCVar3;
            pCVar4->fSecond = pCVar2;
            pCVar4->fType = Sequence;
            pCVar4->fAdoptFirst = true;
            pCVar4->fAdoptSecond = false;
            pCVar4->fMinOccurs = 1;
            pCVar4->fMaxOccurs = 1;
            pCVar3 = pCVar4;
          }
          return pCVar3;
        }
        pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
        pMVar1 = this->fMemoryManager;
        pCVar2->fSecond = (ContentSpecNode *)0x0;
        (pCVar2->super_XSerializable)._vptr_XSerializable =
             (_func_int **)&PTR__ContentSpecNode_00404df0;
        pCVar2->fMemoryManager = pMVar1;
        pCVar2->fElement = (QName *)0x0;
        pCVar2->fElementDecl = (XMLElementDecl *)0x0;
        pCVar2->fFirst = specNode;
        pCVar2->fType = Loop;
        pCVar2->fAdoptFirst = true;
        pCVar2->fAdoptSecond = true;
        pCVar2->fMinOccurs = minOccurs;
        pCVar2->fMaxOccurs = maxOccurs;
        pMVar1 = this->fMemoryManager;
        specNode = pCVar2;
        if (minOccurs == 0) {
          pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,pMVar1);
          NVar5 = ZeroOrMore;
        }
        else {
          pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,pMVar1);
          NVar5 = OneOrMore;
        }
      }
      pMVar1 = this->fMemoryManager;
      (pCVar2->super_XSerializable)._vptr_XSerializable =
           (_func_int **)&PTR__ContentSpecNode_00404df0;
      pCVar2->fMemoryManager = pMVar1;
      pCVar2->fElement = (QName *)0x0;
      pCVar2->fElementDecl = (XMLElementDecl *)0x0;
      pCVar2->fFirst = specNode;
      pCVar2->fSecond = (ContentSpecNode *)0x0;
      pCVar2->fType = NVar5;
      pCVar2->fAdoptFirst = true;
      pCVar2->fAdoptSecond = true;
      pCVar2->fMinOccurs = 1;
      pCVar2->fMaxOccurs = 1;
    }
  }
  return pCVar2;
}

Assistant:

ContentSpecNode* ComplexTypeInfo::expandContentModel(ContentSpecNode* const specNode,
                                                     int minOccurs,
                                                     int maxOccurs,
                                                     bool bAllowCompactSyntax)
{
    if (!specNode) {
        return 0;
    }

    ContentSpecNode* const saveNode = specNode;
    ContentSpecNode* retNode = specNode;

    try
    {
        if (minOccurs == 1 && maxOccurs == 1) {
        }
        else if (minOccurs == 0 && maxOccurs == 1) {

            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::ZeroOrOne
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
        }
        else if (minOccurs == 0 && maxOccurs == -1) {
            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::ZeroOrMore
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
        }
        else if (minOccurs == 1 && maxOccurs == -1) {
            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::OneOrMore
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
        }
        // if what is being repeated is a leaf avoid expanding the tree
        else if(bAllowCompactSyntax &&
            (saveNode->getType()==ContentSpecNode::Leaf ||
            (saveNode->getType() & 0x0f)==ContentSpecNode::Any ||
            (saveNode->getType() & 0x0f)==ContentSpecNode::Any_Other ||
            (saveNode->getType() & 0x0f)==ContentSpecNode::Any_NS))
        {
            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::Loop
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
            retNode->setMinOccurs(minOccurs);
            retNode->setMaxOccurs(maxOccurs);

            if(minOccurs==0)
                retNode = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::ZeroOrMore
                    , retNode
                    , 0
                    , true
                    , true
                    , fMemoryManager
                );
            else
                retNode = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::OneOrMore
                    , retNode
                    , 0
                    , true
                    , true
                    , fMemoryManager
                );

        }
        else if (maxOccurs == -1) {

            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::OneOrMore
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );

            for (int i=0; i < (minOccurs-1); i++) {
                retNode = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::Sequence
                    , saveNode
                    , retNode
                    , false
                    , true
                    , fMemoryManager
                );
            }
        }
        else {

            if (minOccurs == 0) {

                ContentSpecNode* optional = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::ZeroOrOne
                    , saveNode
                    , 0
                    , true
                    , true
                    , fMemoryManager
                );

                retNode = optional;

                for (int i=0; i < (maxOccurs-1); i++) {
                    retNode = new (fMemoryManager) ContentSpecNode
                    (
                        ContentSpecNode::Sequence
                        , retNode
                        , optional
                        , true
                        , false
                        , fMemoryManager
                    );
                }
            }
            else {

                if (minOccurs > 1) {

                    retNode = new (fMemoryManager) ContentSpecNode
                    (
                        ContentSpecNode::Sequence
                        , retNode
                        , saveNode
                        , true
                        , false
                        , fMemoryManager
                    );

                    for (int i=1; i < (minOccurs-1); i++) {
                        retNode = new (fMemoryManager) ContentSpecNode
                        (
                            ContentSpecNode::Sequence
                            , retNode
                            , saveNode
                            , true
                            , false
                            , fMemoryManager
                        );
                    }
                }

                int counter = maxOccurs-minOccurs;

                if (counter > 0) {

                    ContentSpecNode* optional = new (fMemoryManager) ContentSpecNode
                    (
                        ContentSpecNode::ZeroOrOne
                        , saveNode
                        , 0
                        , false
                        , true
                        , fMemoryManager
                    );

                    try
                    {
                        retNode = new (fMemoryManager) ContentSpecNode
                        (
                            ContentSpecNode::Sequence
                            , retNode
                            , optional
                            , true
                            , true
                            , fMemoryManager
                        );
                    }
                    catch( const OutOfMemoryException& )
                    {
                        delete optional;
                        throw;
                    }

                    for (int j=1; j < counter; j++) {

                        retNode = new (fMemoryManager) ContentSpecNode
                        (
                            ContentSpecNode::Sequence
                            , retNode
                            , optional
                            , true
                            , false
                            , fMemoryManager
                        );
                    }
                }
            }
        }
    }
    catch( const OutOfMemoryException& )
    {
        delete retNode;
        throw;
    }

    return retNode;
}